

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool __thiscall Datetime::parse_second(Datetime *this,Pig *pig,int *value)

{
  bool bVar1;
  size_type previous;
  int second;
  uint local_2c;
  
  previous = Pig::cursor(pig);
  bVar1 = Pig::getDigit2(pig,(int *)&local_2c);
  if (local_2c < 0x3c && bVar1) {
    *value = local_2c;
  }
  else {
    Pig::restoreTo(pig,previous);
  }
  return local_2c < 0x3c && bVar1;
}

Assistant:

bool Datetime::parse_second (Pig& pig, int& value)
{
  auto checkpoint = pig.cursor ();

  int second;
  if (pig.getDigit2 (second) &&
      second >= 0            &&
      second < 60)
  {
    value = second;
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}